

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

Array<kj::StringPtr> * __thiscall
kj::heapArray<kj::StringPtr,kj::StringPtr_const*>
          (Array<kj::StringPtr> *__return_storage_ptr__,kj *this,StringPtr *begin,StringPtr *end)

{
  StringPtr *__dest;
  Array<kj::StringPtr> *result;
  size_t __n;
  ArrayBuilder<kj::StringPtr> local_48;
  
  __dest = _::HeapArrayDisposer::allocateUninitialized<kj::StringPtr>((long)begin - (long)this >> 4)
  ;
  local_48.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  __n = (long)begin - (long)this;
  if (__n != 0) {
    memcpy(__dest,this,__n);
  }
  __return_storage_ptr__->ptr = __dest;
  __return_storage_ptr__->size_ = (long)__n >> 4;
  __return_storage_ptr__->disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_48.ptr = (StringPtr *)0x0;
  local_48.pos = (RemoveConst<kj::StringPtr> *)0x0;
  local_48.endPtr = (StringPtr *)0x0;
  ArrayBuilder<kj::StringPtr>::dispose(&local_48);
  return __return_storage_ptr__;
}

Assistant:

Array<T>
heapArray(Iterator begin, Iterator end) {
  ArrayBuilder<T> builder = heapArrayBuilder<T>(end - begin);
  builder.addAll(begin, end);
  return builder.finish();
}